

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

void __thiscall deqp::egl::Image::ImageTests::~ImageTests(ImageTests *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_003ef288;
  lVar3 = 0x600;
  do {
    plVar1 = *(long **)((long)(this->m_createActions).m_actions + lVar3 + -0x10);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      *(undefined8 *)((long)(this->m_createActions).m_actions + lVar3 + -0x10) = 0;
    }
    plVar2 = (long *)((long)(this->m_createActions).m_actions + lVar3 + -0x20);
    plVar1 = *(long **)((long)((this->m_createActions).m_actions + -1) + lVar3);
    if (plVar2 != plVar1) {
      operator_delete(plVar1,*plVar2 + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != 0);
  TestCaseGroup::~TestCaseGroup(&this->super_TestCaseGroup);
  operator_delete(this,0x680);
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}